

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sup.c
# Opt level: O0

void supivoc(supcxdef *ctx)

{
  long lVar1;
  long in_RDI;
  objnum obj;
  int j;
  int i;
  voccxdef *voc;
  vocidef **v;
  vocidef ***vpg;
  voccxdef *in_stack_00000038;
  supcxdef *in_stack_00000040;
  int local_28;
  int local_24;
  long *local_18;
  long *local_10;
  
  lVar1 = *(long *)(in_RDI + 0x10);
  vocdelinh((voccxdef *)0x124f11);
  local_10 = (long *)(lVar1 + 0x58);
  for (local_24 = 0; local_24 < 0x80; local_24 = local_24 + 1) {
    if (*local_10 != 0) {
      local_18 = (long *)*local_10;
      for (local_28 = 0; local_28 < 0x100; local_28 = local_28 + 1) {
        if ((*local_18 != 0) && ((*(byte *)(*local_18 + 8) & 1) == 0)) {
          *(undefined2 *)(*local_18 + 0xc) = 0xffff;
          supivoc1(in_stack_00000040,in_stack_00000038,(vocidef *)ctx,vpg._6_2_,(int)vpg,v._4_4_);
        }
        local_18 = local_18 + 1;
      }
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void supivoc(supcxdef *ctx)
{
    vocidef ***vpg;
    vocidef  **v;
    voccxdef  *voc = ctx->supcxvoc;
    int        i;
    int        j;
    objnum     obj;
    
    /* delete all existing inherited words */
    vocdelinh(voc);
    
    for (vpg = voc->voccxinh, i = 0 ; i < VOCINHMAX ; ++vpg, ++i)
    {
        if (!*vpg) continue;                     /* no entries on this page */
        for (v = *vpg, obj = (i << 8), j = 0 ; j < 256 ; ++v, ++obj, ++j)
        {
            /* if it's not a class, inherit vocabulary for the object */
            if (!*v) continue;
            if (!((*v)->vociflg & VOCIFCLASS))
            {
                (*v)->vociilc = MCMONINV;      /* no inherited location yet */
                supivoc1(ctx, ctx->supcxvoc, *v, obj, FALSE, 0);
            }
        }
    }
}